

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
IDisk::GetCAT_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,IDisk *this,AutorunType *autorun_type,int user)

{
  char *__s;
  ushort uVar1;
  uint uVar2;
  MFMTrack *pMVar3;
  uchar *puVar4;
  ILog *pIVar5;
  bool bVar6;
  uint uVar7;
  void *__s_00;
  ulong uVar8;
  size_t sVar9;
  pointer paVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint track;
  int iVar18;
  byte bVar19;
  uint uVar20;
  string str;
  Track track_info;
  value_type local_a8;
  Track local_88;
  ulong local_68;
  uint *local_60;
  IDisk *local_58;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *autorun_type = AUTO_UNKNOWN;
  local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  GetTrackInfo(this,0,0,&local_88);
  if (local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_start) goto LAB_001666f0;
  track = 0;
  paVar10 = local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (paVar10->r == 'A') {
      track = 2;
    }
    paVar10 = paVar10 + 1;
  } while (paVar10 !=
           local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
           _M_impl.super__Vector_impl_data._M_finish);
  bVar19 = (local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_start)->r;
  if ((bVar19 & 0xc0) == 0x40) {
    *autorun_type = AUTO_FILE;
    uVar12 = 0x41;
LAB_00166427:
    if (track != 0) goto LAB_00166467;
LAB_0016643f:
    track = 0;
  }
  else {
    if (0xbf < bVar19) {
      *autorun_type = AUTO_FILE;
      uVar12 = 0xc1;
      goto LAB_0016643f;
    }
    uVar12 = 0;
    if (0x3f < bVar19) goto LAB_00166427;
    *autorun_type = AUTO_CPM;
    track = 1;
    uVar12 = 1;
LAB_00166467:
    local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
         _M_impl.super__Vector_impl_data._M_start;
    GetTrackInfo(this,0,track,&local_88);
  }
  __s_00 = operator_new__(0x800);
  iVar11 = 0;
  memset(__s_00,0,0x800);
  if ((long)local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    uVar13 = ((long)local_88.list_sector_.
                    super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_88.list_sector_.
                    super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
    pMVar3 = this->side_[0].tracks;
    local_60 = &pMVar3[track].size;
    local_68 = (ulong)uVar12;
    uVar15 = 0;
    uVar8 = 0;
    do {
      if ((uVar12 <= local_88.list_sector_.
                     super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar15].r) &&
         (lVar16 = local_88.list_sector_.
                   super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15].r - local_68, (int)lVar16 < 4)) {
        uVar17 = lVar16 * 0x200;
        iVar11 = iVar11 + 1;
        uVar1 = local_88.list_sector_.
                super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                super__Vector_impl_data._M_start[uVar15].real_size;
        if (uVar1 == 0) {
          uVar8 = uVar17 & 0xffffffff;
        }
        else {
          iVar18 = local_88.list_sector_.
                   super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar15].dam_offset + 0x40;
          uVar2 = *local_60;
          puVar4 = pMVar3[track].bitfield;
          uVar14 = 0;
          do {
            uVar7 = iVar18 + 1;
            uVar20 = 0xfffffffe;
            bVar19 = 0;
            do {
              if (uVar2 <= uVar7) {
                uVar7 = uVar7 % uVar2;
              }
              bVar19 = puVar4[uVar7] & 1 | bVar19 * '\x02';
              uVar7 = uVar7 + 2;
              uVar20 = uVar20 + 2;
            } while (uVar20 < 0xe);
            uVar8 = uVar17 + 1;
            *(byte *)((long)__s_00 + uVar17) = bVar19;
            uVar14 = uVar14 + 1;
          } while ((uVar14 < uVar1) &&
                  (iVar18 = iVar18 + 0x10, bVar6 = (long)uVar17 < 0x7ff, uVar17 = uVar8, bVar6));
        }
      }
      uVar15 = (ulong)((int)uVar15 + 1);
    } while ((uVar15 <= uVar13 && uVar13 - uVar15 != 0) && ((iVar11 < 4 && ((int)uVar8 < 0x800))));
    local_58 = this;
    if (0 < (int)uVar8) {
      uVar13 = 0;
      iVar11 = 0;
      do {
        pIVar5 = this->log_;
        if (pIVar5 != (ILog *)0x0) {
          (**(code **)(*(long *)pIVar5 + 8))(pIVar5,*(undefined1 *)((long)__s_00 + uVar13));
          pIVar5 = this->log_;
          if (pIVar5 != (ILog *)0x0) {
            (*(code *)**(undefined8 **)pIVar5)(pIVar5," ");
          }
        }
        iVar11 = iVar11 + 1;
        if (iVar11 == 0x10) {
          iVar11 = 0;
          if (this->log_ != (ILog *)0x0) {
            (**(code **)(*(long *)this->log_ + 0x20))();
          }
        }
        uVar13 = uVar13 + 1;
      } while ((uVar8 & 0xffffffff) != uVar13);
    }
  }
  uVar8 = 1;
  do {
    if ((user == -1) || ((uint)*(byte *)((long)__s_00 + (uVar8 - 1)) == user)) {
      __s = (char *)((long)__s_00 + uVar8);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      sVar9 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,__s,__s + sVar9);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      bVar6 = ValidName(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
    bVar6 = uVar8 < 0x7e0;
    uVar8 = uVar8 + 0x20;
  } while (bVar6);
  operator_delete__(__s_00);
LAB_001666f0:
  if (local_88.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.list_sector_.
                    super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.list_sector_.
                          super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.list_sector_.
                          super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>  IDisk::GetCAT(IDisk::AutorunType& autorun_type, int user)
{
   std::vector<std::string> filename_vector;
   autorun_type = IDisk::AUTO_UNKNOWN;

   // Get info
   IDisk::Track track_info;
   GetTrackInfo(0, 0, &track_info);

   if (track_info.list_sector_.size() == 0)
   {
      return filename_vector;
   }

   // CPM ?
   int index_cat = 0;
   unsigned char first_sector = 00;
   // A |CPM can be run if a"0x41" sector is found
   for (auto it = track_info.list_sector_.begin(); it != track_info.list_sector_.end(); ++it)
   {
      if (it->r == 0x41)
      {
         index_cat = 2;
      }
   }

   // SYSTEM / VENDOR
   if ((track_info.list_sector_.at(0).r & 0xC0) == 0x40)
   {
      first_sector = 0x41;
      autorun_type = IDisk::AUTO_FILE;
   }
   // DATA
   else if ((track_info.list_sector_.at(0).r & 0xC0) == 0xC0)
   {
      index_cat = 0;
      first_sector = 0xC1;
      autorun_type = IDisk::AUTO_FILE;
   }
   // IBM
   else if ((track_info.list_sector_.at(0).r & 0xC0) == 0x00
      || (track_info.list_sector_.at(0).r & 0xC0) == 0x80)
   {
      index_cat = 1;
      first_sector = 0x01;
      autorun_type = IDisk::AUTO_CPM;
   }

   if (index_cat != 0)
   {
      track_info.list_sector_.clear();
      GetTrackInfo(0, index_cat, &track_info);
   }

#define NB_SECTOR_FOR_CAT 4

   int total_size = NB_SECTOR_FOR_CAT * 512;
   /*for (int i = 0; i < NB_SECTOR_FOR_CAT && i < trackInfo.listSector.size(); i++)
   {
      totalSize += trackInfo.listSector.at(i).RealSize;
   }*/

   // No, try to fins appropriate file to run
   unsigned char* track_data = new unsigned char[total_size];
   memset(track_data, 0, total_size);
   int offset_data = 0;


   // It's in first track, NB_SECTOR_FOR_CAT firsts sectors, from first_sector to first_sector + NB_SECTOR_FOR_CAT
   // todo : read the proper sectors !
   int nb_sector_read = 0;

   //for (int i = 0; i < NB_SECTOR_FOR_CAT && i < trackInfo.listSector.size(); i++)
   unsigned int index_sector = 0;
   int nb_read_sector = 0;
   while (index_sector < track_info.list_sector_.size() && nb_read_sector < NB_SECTOR_FOR_CAT && offset_data < total_size)
   {
      // Read first xx sectors
      if (track_info.list_sector_.at(index_sector).r >= first_sector)
      {
         if (track_info.list_sector_.at(index_sector).r - first_sector < NB_SECTOR_FOR_CAT)
         {
            int index = track_info.list_sector_.at(index_sector).dam_offset + 64;

            offset_data = (track_info.list_sector_.at(index_sector).r - first_sector) * 512;
            nb_read_sector++;
            for (int cpt = 0; cpt < track_info.list_sector_.at(index_sector).real_size && offset_data < total_size; cpt++)
            {
               // Walk all of them - remove the 0x80 bits
               unsigned char b = GetNextByte(0, index_cat, index);
               track_data[offset_data++] = b;
               index += 16;
            }
         }
      }
      index_sector++;
   }

   // Dump TrackData
   int line_count = 0;
   for (int hex = 0; hex < offset_data; hex++)
   {
      LOGB(track_data[hex]);
      LOG(" ");
      if (++line_count == 16)
      {
         LOGEOL
            line_count = 0;
      }
   }

   int offset = 1;
   bool end = false;

   while (offset < total_size && !end)
   {
      if (user == -1 || track_data[offset - 1] == user)
      {
         // Add to the name vector
         std::string str = (const char*)(&track_data[offset]);
         if (ValidName(str))
         {
            filename_vector.push_back(str);
         }
      }
      offset += 32;
   }
   delete[]track_data;

   return filename_vector;
}